

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O0

void __thiscall OPL_RDOSdump::WriteDelay(OPL_RDOSdump *this,int ticks)

{
  undefined1 local_16;
  undefined1 local_15;
  int local_14;
  BYTE delay [2];
  OPL_RDOSdump *pOStack_10;
  int ticks_local;
  OPL_RDOSdump *this_local;
  
  if (0 < ticks) {
    local_14 = (this->super_OPLDump).TickMul * ticks;
    local_15 = 0;
    pOStack_10 = this;
    while (0xff < local_14) {
      local_14 = local_14 + -0xff;
      local_16 = 0xff;
      fwrite(&local_16,1,2,(FILE *)(this->super_OPLDump).File);
    }
    local_16 = (undefined1)local_14;
    fwrite(&local_16,1,2,(FILE *)(this->super_OPLDump).File);
  }
  return;
}

Assistant:

virtual void WriteDelay(int ticks)
	{
		if (ticks > 0)
		{ // RDos raw has very precise delays but isn't very efficient at
		  // storing long delays.
			BYTE delay[2];

			ticks *= TickMul;
			delay[1] = 0;
			while (ticks > 255)
			{
				ticks -= 255;
				delay[0] = 255;
				fwrite(delay, 1, 2, File);
			}
			delay[0] = BYTE(ticks);
			fwrite(delay, 1, 2, File);
		}
	}